

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O0

void __thiscall FMapInfoParser::ParseSkill(FMapInfoParser *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FString *this_00;
  char *pcVar6;
  FSkillInfo *pFVar7;
  double dVar8;
  uint local_130;
  FName local_12c;
  uint i;
  FName local_124;
  FName pc;
  FName local_11c;
  FName local_118;
  FName local_114;
  FName local_110;
  FName replacer;
  FName replaced;
  undefined1 local_f8 [6];
  bool acsreturnisset;
  bool thisisdefault;
  FSkillInfo skill;
  FMapInfoParser *this_local;
  
  skill._224_8_ = this;
  FSkillInfo::FSkillInfo((FSkillInfo *)local_f8);
  bVar2 = false;
  bVar1 = false;
  skill.Name.Index = 0;
  skill._4_4_ = 0x3ff00000;
  skill.AmmoFactor = 2.0;
  skill.DoubleAmmoFactor = -1.0;
  skill.DropAmmoFactor = 1.0;
  skill.DamageFactor = 1.0;
  skill.ArmorFactor = 1.0;
  skill.HealthFactor._0_1_ = 0;
  skill.HealthFactor._1_1_ = 0;
  skill.HealthFactor._2_1_ = 0;
  skill.HealthFactor._4_1_ = 0;
  skill.HealthFactor._5_1_ = 0;
  skill.HealthFactor._3_1_ = 0;
  skill.FastMonsters = false;
  skill.SlowMonsters = false;
  skill.DisableCheats = false;
  skill.AutoUseHealth = false;
  skill.EasyBossBrain = false;
  skill.EasyKey = false;
  skill._62_2_ = 0;
  skill.RespawnCounter = 0;
  skill.RespawnLimit = 0x3ff00000;
  skill.Aggressiveness._0_4_ = 0;
  skill.Aggressiveness._4_4_ = 0;
  skill.MenuNamesForPlayerClass.Size._0_1_ = 0;
  skill.MustConfirmText.Chars._0_1_ = 0;
  FString::operator=((FString *)&skill.Shortcut,"");
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::Clear
            ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)&skill.TextColor,1);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::Clear
            ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)&skill.Replace.Size,1);
  skill.Replaced.Size = 0;
  skill.Replaced.NumUsed = 0x3ff00000;
  skill.MonsterHealth = 1.0;
  skill.FriendlyHealth._0_1_ = 0;
  skill.FriendlyHealth._4_4_ = 0;
  FScanner::MustGetString(&this->sc);
  FName::operator=((FName *)local_f8,(this->sc).String);
  ParseOpenBrace(this);
  while (bVar3 = FScanner::GetString(&this->sc), bVar3) {
    bVar3 = FScanner::Compare(&this->sc,"ammofactor");
    if (bVar3) {
      ParseAssign(this);
      FScanner::MustGetFloat(&this->sc);
      skill._0_8_ = (this->sc).Float;
    }
    else {
      bVar3 = FScanner::Compare(&this->sc,"doubleammofactor");
      if (bVar3) {
        ParseAssign(this);
        FScanner::MustGetFloat(&this->sc);
        skill.AmmoFactor = (this->sc).Float;
      }
      else {
        bVar3 = FScanner::Compare(&this->sc,"dropammofactor");
        if (bVar3) {
          ParseAssign(this);
          FScanner::MustGetFloat(&this->sc);
          skill.DoubleAmmoFactor = (this->sc).Float;
        }
        else {
          bVar3 = FScanner::Compare(&this->sc,"damagefactor");
          if (bVar3) {
            ParseAssign(this);
            FScanner::MustGetFloat(&this->sc);
            skill.DropAmmoFactor = (this->sc).Float;
          }
          else {
            bVar3 = FScanner::Compare(&this->sc,"fastmonsters");
            if (bVar3) {
              skill.HealthFactor._0_1_ = 1;
            }
            else {
              bVar3 = FScanner::Compare(&this->sc,"slowmonsters");
              if (bVar3) {
                skill.HealthFactor._1_1_ = 1;
              }
              else {
                bVar3 = FScanner::Compare(&this->sc,"disablecheats");
                if (bVar3) {
                  skill.HealthFactor._2_1_ = 1;
                }
                else {
                  bVar3 = FScanner::Compare(&this->sc,"easybossbrain");
                  if (bVar3) {
                    skill.HealthFactor._4_1_ = 1;
                  }
                  else {
                    bVar3 = FScanner::Compare(&this->sc,"easykey");
                    if (bVar3) {
                      skill.HealthFactor._5_1_ = 1;
                    }
                    else {
                      bVar3 = FScanner::Compare(&this->sc,"autousehealth");
                      if (bVar3) {
                        skill.HealthFactor._3_1_ = 1;
                      }
                      else {
                        bVar3 = FScanner::Compare(&this->sc,"respawntime");
                        if (bVar3) {
                          ParseAssign(this);
                          FScanner::MustGetFloat(&this->sc);
                          skill._56_4_ = (BADTYPE)((this->sc).Float * 35.0);
                        }
                        else {
                          bVar3 = FScanner::Compare(&this->sc,"respawnlimit");
                          if (bVar3) {
                            ParseAssign(this);
                            FScanner::MustGetNumber(&this->sc);
                            skill._60_4_ = (this->sc).Number;
                          }
                          else {
                            bVar3 = FScanner::Compare(&this->sc,"Aggressiveness");
                            if (bVar3) {
                              ParseAssign(this);
                              FScanner::MustGetFloat(&this->sc);
                              dVar8 = clamp<double>((this->sc).Float,0.0,1.0);
                              skill._64_8_ = 1.0 - dVar8;
                            }
                            else {
                              bVar3 = FScanner::Compare(&this->sc,"SpawnFilter");
                              if (bVar3) {
                                ParseAssign(this);
                                bVar3 = FScanner::CheckNumber(&this->sc);
                                if (bVar3) {
                                  if (0 < (this->sc).Number) {
                                    skill.Aggressiveness._0_4_ =
                                         1 << ((char)(this->sc).Number - 1U & 0x1f) |
                                         skill.Aggressiveness._0_4_;
                                  }
                                }
                                else {
                                  FScanner::MustGetString(&this->sc);
                                  bVar3 = FScanner::Compare(&this->sc,"baby");
                                  if (bVar3) {
                                    skill.Aggressiveness._0_4_ = skill.Aggressiveness._0_4_ | 1;
                                  }
                                  else {
                                    bVar3 = FScanner::Compare(&this->sc,"easy");
                                    if (bVar3) {
                                      skill.Aggressiveness._0_4_ = skill.Aggressiveness._0_4_ | 2;
                                    }
                                    else {
                                      bVar3 = FScanner::Compare(&this->sc,"normal");
                                      if (bVar3) {
                                        skill.Aggressiveness._0_4_ = skill.Aggressiveness._0_4_ | 4;
                                      }
                                      else {
                                        bVar3 = FScanner::Compare(&this->sc,"hard");
                                        if (bVar3) {
                                          skill.Aggressiveness._0_4_ =
                                               skill.Aggressiveness._0_4_ | 8;
                                        }
                                        else {
                                          bVar3 = FScanner::Compare(&this->sc,"nightmare");
                                          if (bVar3) {
                                            skill.Aggressiveness._0_4_ =
                                                 skill.Aggressiveness._0_4_ | 0x10;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                bVar3 = FScanner::Compare(&this->sc,"ACSReturn");
                                if (bVar3) {
                                  ParseAssign(this);
                                  FScanner::MustGetNumber(&this->sc);
                                  skill.Aggressiveness._4_4_ = (this->sc).Number;
                                  bVar1 = true;
                                }
                                else {
                                  bVar3 = FScanner::Compare(&this->sc,"ReplaceActor");
                                  if (bVar3) {
                                    ParseAssign(this);
                                    FScanner::MustGetString(&this->sc);
                                    FName::FName(&local_110,(this->sc).String);
                                    ParseComma(this);
                                    FScanner::MustGetString(&this->sc);
                                    FName::FName(&local_114,(this->sc).String);
                                    FName::FName(&local_118,&local_110);
                                    FName::FName(&local_11c,&local_114);
                                    FSkillInfo::SetReplacement
                                              ((FSkillInfo *)local_f8,&local_118,&local_11c);
                                    FName::FName(&pc,&local_114);
                                    FName::FName(&local_124,&local_110);
                                    FSkillInfo::SetReplacedBy((FSkillInfo *)local_f8,&pc,&local_124)
                                    ;
                                  }
                                  else {
                                    bVar3 = FScanner::Compare(&this->sc,"Name");
                                    if (bVar3) {
                                      ParseAssign(this);
                                      FScanner::MustGetString(&this->sc);
                                      FString::operator=((FString *)&skill.SpawnFilter,
                                                         (this->sc).String);
                                    }
                                    else {
                                      bVar3 = FScanner::Compare(&this->sc,"PlayerClassName");
                                      if (bVar3) {
                                        ParseAssign(this);
                                        FScanner::MustGetString(&this->sc);
                                        FName::FName((FName *)&i,(this->sc).String);
                                        ParseComma(this);
                                        FScanner::MustGetString(&this->sc);
                                        pcVar6 = (this->sc).String;
                                        FName::FName(&local_12c,(FName *)&i);
                                        this_00 = TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>
                                                  ::operator[]((
                                                  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>
                                                  *)&skill.PicName,&local_12c);
                                        FString::operator=(this_00,pcVar6);
                                      }
                                      else {
                                        bVar3 = FScanner::Compare(&this->sc,"PicName");
                                        if (bVar3) {
                                          ParseAssign(this);
                                          FScanner::MustGetString(&this->sc);
                                          FString::operator=(&skill.MenuName,(this->sc).String);
                                        }
                                        else {
                                          bVar3 = FScanner::Compare(&this->sc,"MustConfirm");
                                          if (bVar3) {
                                            skill.MenuNamesForPlayerClass.Size._0_1_ = 1;
                                            if (this->format_type == 2) {
                                              bVar3 = CheckAssign(this);
                                              if (bVar3) {
                                                FScanner::MustGetString(&this->sc);
                                                FString::operator=((FString *)&skill.MustConfirm,
                                                                   (this->sc).String);
                                              }
                                            }
                                            else {
                                              bVar3 = FScanner::CheckToken(&this->sc,0x102);
                                              if (bVar3) {
                                                FString::operator=((FString *)&skill.MustConfirm,
                                                                   (this->sc).String);
                                              }
                                            }
                                          }
                                          else {
                                            bVar3 = FScanner::Compare(&this->sc,"Key");
                                            if (bVar3) {
                                              ParseAssign(this);
                                              FScanner::MustGetString(&this->sc);
                                              iVar4 = tolower((int)*(this->sc).String);
                                              skill.MustConfirmText.Chars._0_1_ = (undefined1)iVar4;
                                            }
                                            else {
                                              bVar3 = FScanner::Compare(&this->sc,"TextColor");
                                              if (bVar3) {
                                                ParseAssign(this);
                                                FScanner::MustGetString(&this->sc);
                                                FString::Format((FString *)&skill.Shortcut,"[%s]",
                                                                (this->sc).String);
                                              }
                                              else {
                                                bVar3 = FScanner::Compare(&this->sc,"MonsterHealth")
                                                ;
                                                if (bVar3) {
                                                  ParseAssign(this);
                                                  FScanner::MustGetFloat(&this->sc);
                                                  skill.Replaced._16_8_ = (this->sc).Float;
                                                }
                                                else {
                                                  bVar3 = FScanner::Compare(&this->sc,
                                                                            "FriendlyHealth");
                                                  if (bVar3) {
                                                    ParseAssign(this);
                                                    FScanner::MustGetFloat(&this->sc);
                                                    skill.MonsterHealth = (this->sc).Float;
                                                  }
                                                  else {
                                                    bVar3 = FScanner::Compare(&this->sc,"NoPain");
                                                    if (bVar3) {
                                                      skill.FriendlyHealth._0_1_ = 1;
                                                    }
                                                    else {
                                                      bVar3 = FScanner::Compare(&this->sc,
                                                                                "ArmorFactor");
                                                      if (bVar3) {
                                                        ParseAssign(this);
                                                        FScanner::MustGetFloat(&this->sc);
                                                        skill.DamageFactor = (this->sc).Float;
                                                      }
                                                      else {
                                                        bVar3 = FScanner::Compare(&this->sc,
                                                                                  "HealthFactor");
                                                        if (bVar3) {
                                                          ParseAssign(this);
                                                          FScanner::MustGetFloat(&this->sc);
                                                          skill.ArmorFactor = (this->sc).Float;
                                                        }
                                                        else {
                                                          bVar3 = FScanner::Compare(&this->sc,
                                                                                    "NoInfighting");
                                                          if (bVar3) {
                                                            skill.FriendlyHealth._4_4_ = 0x4000;
                                                          }
                                                          else {
                                                            bVar3 = FScanner::Compare(&this->sc,
                                                                                                                                                                            
                                                  "TotalInfighting");
                                                  if (bVar3) {
                                                    skill.FriendlyHealth._4_4_ = 0x2000;
                                                  }
                                                  else {
                                                    bVar3 = FScanner::Compare(&this->sc,
                                                                              "DefaultSkill");
                                                    if (bVar3) {
                                                      if (-1 < DefaultSkill) {
                                                        pFVar7 = TArray<FSkillInfo,_FSkillInfo>::
                                                                 operator[](&AllSkills,
                                                                            (long)DefaultSkill);
                                                        pcVar6 = FName::GetChars(&pFVar7->Name);
                                                        FScanner::ScriptError
                                                                  (&this->sc,
                                                                                                                                      
                                                  "%s is already the default skill\n",pcVar6);
                                                  }
                                                  bVar2 = true;
                                                  }
                                                  else {
                                                    bVar3 = ParseCloseBrace(this);
                                                    if (bVar3) break;
                                                    FScanner::ScriptMessage
                                                              (&this->sc,
                                                                                                                              
                                                  "Unknown property \'%s\' found in skill definition\n"
                                                  ,(this->sc).String);
                                                  SkipToNext(this);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  CheckEndOfFile(this,"skill");
  local_130 = 0;
  do {
    uVar5 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
    if (uVar5 <= local_130) {
      if (!bVar1) {
        skill.Aggressiveness._4_4_ = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
      }
      if (bVar2) {
        DefaultSkill = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
      }
      TArray<FSkillInfo,_FSkillInfo>::Push(&AllSkills,(FSkillInfo *)local_f8);
LAB_005daef8:
      FSkillInfo::~FSkillInfo((FSkillInfo *)local_f8);
      return;
    }
    pFVar7 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(ulong)local_130);
    bVar3 = FName::operator==(&pFVar7->Name,(FName *)local_f8);
    if (bVar3) {
      if (!bVar1) {
        pFVar7 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(ulong)local_130);
        skill.Aggressiveness._4_4_ = pFVar7->ACSReturn;
      }
      pFVar7 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(ulong)local_130);
      FSkillInfo::operator=(pFVar7,(FSkillInfo *)local_f8);
      if (bVar2) {
        DefaultSkill = local_130;
      }
      goto LAB_005daef8;
    }
    local_130 = local_130 + 1;
  } while( true );
}

Assistant:

void FMapInfoParser::ParseSkill ()
{
	FSkillInfo skill;
	bool thisisdefault = false;
	bool acsreturnisset = false;

	skill.AmmoFactor = 1.;
	skill.DoubleAmmoFactor = 2.;
	skill.DropAmmoFactor = -1.;
	skill.DamageFactor = 1.;
	skill.ArmorFactor = 1.;
	skill.HealthFactor = 1.;
	skill.FastMonsters = false;
	skill.SlowMonsters = false;
	skill.DisableCheats = false;
	skill.EasyBossBrain = false;
	skill.EasyKey = false;
	skill.AutoUseHealth = false;
	skill.RespawnCounter = 0;
	skill.RespawnLimit = 0;
	skill.Aggressiveness = 1.;
	skill.SpawnFilter = 0;
	skill.ACSReturn = 0;
	skill.MustConfirm = false;
	skill.Shortcut = 0;
	skill.TextColor = "";
	skill.Replace.Clear();
	skill.Replaced.Clear();
	skill.MonsterHealth = 1.;
	skill.FriendlyHealth = 1.;
	skill.NoPain = false;
	skill.Infighting = 0;

	sc.MustGetString();
	skill.Name = sc.String;

	ParseOpenBrace();

	while (sc.GetString ())
	{
		if (sc.Compare ("ammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.AmmoFactor = sc.Float;
		}
		else if (sc.Compare ("doubleammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DoubleAmmoFactor = sc.Float;
		}
		else if (sc.Compare ("dropammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DropAmmoFactor = sc.Float;
		}
		else if (sc.Compare ("damagefactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DamageFactor = sc.Float;
		}
		else if (sc.Compare ("fastmonsters"))
		{
			skill.FastMonsters = true;
		}
		else if (sc.Compare ("slowmonsters"))
		{
			skill.SlowMonsters = true;
		}
		else if (sc.Compare ("disablecheats"))
		{
			skill.DisableCheats = true;
		}
		else if (sc.Compare ("easybossbrain"))
		{
			skill.EasyBossBrain = true;
		}
		else if (sc.Compare ("easykey"))
		{
			skill.EasyKey = true;
		}
		else if (sc.Compare("autousehealth"))
		{
			skill.AutoUseHealth = true;
		}
		else if (sc.Compare("respawntime"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.RespawnCounter = int(sc.Float*TICRATE);
		}
		else if (sc.Compare("respawnlimit"))
		{
			ParseAssign();
			sc.MustGetNumber ();
			skill.RespawnLimit = sc.Number;
		}
		else if (sc.Compare("Aggressiveness"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.Aggressiveness = 1. - clamp(sc.Float, 0.,1.);
		}
		else if (sc.Compare("SpawnFilter"))
		{
			ParseAssign();
			if (sc.CheckNumber())
			{
				if (sc.Number > 0) skill.SpawnFilter |= (1<<(sc.Number-1));
			}
			else
			{
				sc.MustGetString ();
				if (sc.Compare("baby")) skill.SpawnFilter |= 1;
				else if (sc.Compare("easy")) skill.SpawnFilter |= 2;
				else if (sc.Compare("normal")) skill.SpawnFilter |= 4;
				else if (sc.Compare("hard")) skill.SpawnFilter |= 8;
				else if (sc.Compare("nightmare")) skill.SpawnFilter |= 16;
			}
		}
		else if (sc.Compare("ACSReturn"))
		{
			ParseAssign();
			sc.MustGetNumber ();
			skill.ACSReturn = sc.Number;
			acsreturnisset = true;
		}
		else if (sc.Compare("ReplaceActor"))
		{
			ParseAssign();
			sc.MustGetString();
			FName replaced = sc.String;
			ParseComma();
			sc.MustGetString();
			FName replacer = sc.String;
			skill.SetReplacement(replaced, replacer);
			skill.SetReplacedBy(replacer, replaced);
		}
		else if (sc.Compare("Name"))
		{
			ParseAssign();
			sc.MustGetString ();
			skill.MenuName = sc.String;
		}
		else if (sc.Compare("PlayerClassName"))
		{
			ParseAssign();
			sc.MustGetString ();
			FName pc = sc.String;
			ParseComma();
			sc.MustGetString ();
			skill.MenuNamesForPlayerClass[pc]=sc.String;
		}
		else if (sc.Compare("PicName"))
		{
			ParseAssign();
			sc.MustGetString ();
			skill.PicName = sc.String;
		}
		else if (sc.Compare("MustConfirm"))
		{
			skill.MustConfirm = true;
			if (format_type == FMT_New) 
			{
				if (CheckAssign())
				{
					sc.MustGetString();
					skill.MustConfirmText = sc.String;
				}
			}
			else
			{
				if (sc.CheckToken(TK_StringConst))
				{
					skill.MustConfirmText = sc.String;
				}
			}
		}
		else if (sc.Compare("Key"))
		{
			ParseAssign();
			sc.MustGetString();
			skill.Shortcut = tolower(sc.String[0]);
		}
		else if (sc.Compare("TextColor"))
		{
			ParseAssign();
			sc.MustGetString();
			skill.TextColor.Format("[%s]", sc.String);
		}
		else if (sc.Compare("MonsterHealth"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.MonsterHealth = sc.Float;	
		}
		else if (sc.Compare("FriendlyHealth"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.FriendlyHealth = sc.Float;
		}
		else if (sc.Compare("NoPain"))
		{
			skill.NoPain = true;
		}
		else if (sc.Compare("ArmorFactor"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.ArmorFactor = sc.Float;
		}
		else if (sc.Compare("HealthFactor"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.HealthFactor = sc.Float;
		}
		else if (sc.Compare("NoInfighting"))
		{
			skill.Infighting = LEVEL2_NOINFIGHTING;
		}
		else if (sc.Compare("TotalInfighting"))
		{
			skill.Infighting = LEVEL2_TOTALINFIGHTING;
		}
		else if (sc.Compare("DefaultSkill"))
		{
			if (DefaultSkill >= 0)
			{
				sc.ScriptError("%s is already the default skill\n", AllSkills[DefaultSkill].Name.GetChars());
			}
			thisisdefault = true;
		}
		else if (!ParseCloseBrace())
		{
			// Unknown
			sc.ScriptMessage("Unknown property '%s' found in skill definition\n", sc.String);
			SkipToNext();
		}
		else
		{
			break;
		}
	}
	CheckEndOfFile("skill");
	for(unsigned int i = 0; i < AllSkills.Size(); i++)
	{
		if (AllSkills[i].Name == skill.Name)
		{
			if (!acsreturnisset)
			{ // Use the ACS return for the skill we are overwriting.
				skill.ACSReturn = AllSkills[i].ACSReturn;
			}
			AllSkills[i] = skill;
			if (thisisdefault)
			{
				DefaultSkill = i;
			}
			return;
		}
	}
	if (!acsreturnisset)
	{
		skill.ACSReturn = AllSkills.Size();
	}
	if (thisisdefault)
	{
		DefaultSkill = AllSkills.Size();
	}
	AllSkills.Push(skill);
}